

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O1

CollationCacheEntry * __thiscall
icu_63::CollationLoader::loadFromData(CollationLoader *this,UErrorCode *errorCode)

{
  Locale *this_00;
  Locale *this_01;
  int iVar1;
  CollationTailoring *this_02;
  uint8_t *__buf;
  UChar *pUVar2;
  char *pcVar3;
  char *pcVar4;
  CollationCacheEntry *this_03;
  UErrorCode internalErrorCode;
  UErrorCode internalErrorCode_1;
  int32_t len;
  int32_t len_1;
  int32_t length;
  LocalUResourceBundlePointer binary;
  LocalUResourceBundlePointer local_78;
  UErrorCode local_6c;
  LocalUResourceBundlePointer local_68;
  int local_60;
  uint local_5c;
  ConstChar16Ptr local_58;
  LocalUResourceBundlePointer local_50;
  Locale *local_48;
  UChar *local_40;
  
  if (U_ZERO_ERROR < *errorCode) {
    return (CollationCacheEntry *)0x0;
  }
  this_02 = (CollationTailoring *)UMemory::operator_new((UMemory *)0x190,(size_t)errorCode);
  if (this_02 == (CollationTailoring *)0x0) {
    this_02 = (CollationTailoring *)0x0;
  }
  else {
    CollationTailoring::CollationTailoring(this_02,this->rootEntry->tailoring->settings);
  }
  if ((this_02 == (CollationTailoring *)0x0) || (this_02->settings == (CollationSettings *)0x0)) {
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
    this_03 = (CollationCacheEntry *)0x0;
    goto LAB_002250d3;
  }
  local_50.super_LocalPointerBase<UResourceBundle>.ptr =
       (LocalPointerBase<UResourceBundle>)
       ures_getByKey_63(this->data,"%%CollationBin",(UResourceBundle *)0x0,errorCode);
  __buf = ures_getBinary_63((UResourceBundle *)local_50.super_LocalPointerBase<UResourceBundle>.ptr,
                            (int32_t *)&local_5c,errorCode);
  CollationDataReader::read((int)this->rootEntry->tailoring,__buf,(ulong)local_5c);
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    local_78.super_LocalPointerBase<UResourceBundle>.ptr =
         (LocalPointerBase<UResourceBundle>)
         ((ulong)local_78.super_LocalPointerBase<UResourceBundle>.ptr & 0xffffffff00000000);
    pUVar2 = ures_getStringByKey_63
                       (this->data,"Sequence",(int32_t *)&local_68,(UErrorCode *)&local_78);
    if ((int)local_78.super_LocalPointerBase<UResourceBundle>.ptr < 1) {
      local_58.p_ = pUVar2;
      UnicodeString::setTo
                (&this_02->rules,'\x01',&local_58,
                 (int32_t)local_68.super_LocalPointerBase<UResourceBundle>.ptr);
      local_40 = local_58.p_;
    }
    this_01 = &this->locale;
    pcVar3 = Locale::getBaseName(this_01);
    local_48 = &this->validLocale;
    pcVar4 = Locale::getBaseName(local_48);
    iVar1 = strcmp(pcVar3,pcVar4);
    if (iVar1 != 0) {
      local_78.super_LocalPointerBase<UResourceBundle>.ptr =
           (LocalPointerBase<UResourceBundle>)ures_open_63("icudt63l-coll",pcVar3,errorCode);
      if (U_ZERO_ERROR < *errorCode) {
        LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&local_78);
        goto LAB_002250ba;
      }
      local_6c = U_ZERO_ERROR;
      local_68.super_LocalPointerBase<UResourceBundle>.ptr =
           (LocalPointerBase<UResourceBundle>)
           ures_getByKeyWithFallback_63
                     ((UResourceBundle *)local_78.super_LocalPointerBase<UResourceBundle>.ptr,
                      "collations/default",(UResourceBundle *)0x0,&local_6c);
      pUVar2 = ures_getString_63((UResourceBundle *)
                                 local_68.super_LocalPointerBase<UResourceBundle>.ptr,&local_60,
                                 &local_6c);
      if (local_60 < 0x10 && local_6c < U_ILLEGAL_ARGUMENT_ERROR) {
        u_UCharsToChars_63(pUVar2,this->defaultType,local_60 + 1);
      }
      else {
        builtin_strncpy(this->defaultType,"standard",9);
      }
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&local_68);
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&local_78);
    }
    this_00 = &this_02->actualLocale;
    Locale::operator=(this_00,this_01);
    iVar1 = strcmp(this->type,this->defaultType);
    if (iVar1 == 0) {
      pcVar3 = (this->locale).fullName;
      pcVar4 = Locale::getBaseName(this_01);
      iVar1 = strcmp(pcVar3,pcVar4);
      if (iVar1 != 0) {
        pcVar4 = "collation";
        Locale::setKeywordValue(this_00,"collation",(char *)0x0,errorCode);
      }
    }
    else {
      pcVar4 = "collation";
      Locale::setKeywordValue(this_00,"collation",this->type,errorCode);
    }
    if (U_ZERO_ERROR < *errorCode) goto LAB_002250ba;
    if (this->typeFallback != '\0') {
      *errorCode = U_USING_DEFAULT_WARNING;
    }
    this_02->bundle = this->bundle;
    this->bundle = (UResourceBundle *)0x0;
    this_03 = (CollationCacheEntry *)UMemory::operator_new((UMemory *)0x100,(size_t)pcVar4);
    if (this_03 == (CollationCacheEntry *)0x0) {
      this_03 = (CollationCacheEntry *)0x0;
    }
    else {
      CollationCacheEntry::CollationCacheEntry(this_03,local_48,this_02);
    }
    if (this_03 == (CollationCacheEntry *)0x0) {
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
      goto LAB_002250ba;
    }
    SharedObject::addRef(&this_03->super_SharedObject);
    this_02 = (CollationTailoring *)0x0;
  }
  else {
LAB_002250ba:
    this_03 = (CollationCacheEntry *)0x0;
  }
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&local_50);
LAB_002250d3:
  if (this_02 != (CollationTailoring *)0x0) {
    (*(this_02->super_SharedObject).super_UObject._vptr_UObject[1])(this_02);
  }
  return this_03;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_getFunctionalEquivalent(char* result, int32_t resultCapacity,
                             const char* keyword, const char* locale,
                             UBool* isAvailable, UErrorCode* status)
{
    // N.B.: Resource name is "collations" but keyword is "collation"
    return ures_getFunctionalEquivalent(result, resultCapacity, U_ICUDATA_COLL,
        "collations", keyword, locale,
        isAvailable, TRUE, status);
}